

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O2

strong_type<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
* __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::map<____C_A_T_C_H____T_E_S_T____28()::__1&>
          (strong_type<std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::result_like_continuation>
           *__return_storage_ptr__,
          impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
          *this,anon_class_1_0_00000001 *fn)

{
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar1;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> *pvVar2;
  _Variadic_union<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined1 local_18;
  
  if (this[0x20] ==
      (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
       )0x0) {
    pvVar2 = result_adapter<std::variant<int,std::__cxx11::string>>::
             get_success<std::variant<int,std::__cxx11::string>>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    local_38._M_first._M_storage = (_Uninitialized<double,_true>)((double)*pvVar2 * 1.5);
    local_18 = 0;
  }
  else {
    pvVar1 = result_adapter<std::variant<int,std::__cxx11::string>>::
             get_error<std::variant<int,std::__cxx11::string>>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    std::__detail::__variant::_Variant_storage<false,double,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string>
              ((_Variant_storage<false,double,std::__cxx11::string> *)&local_38,pvVar1);
  }
  std::__detail::__variant::
  _Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)__return_storage_ptr__,
                    (_Move_ctor_base<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_38._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) map(Fn&& fn) &&
      {
        return _impl::map(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }